

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O2

int Dau_DsdCheckDecExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  int *pnSupp_00;
  uint uVar6;
  char *__assertion;
  uint uVar7;
  long lVar8;
  long lVar9;
  int pSupps [8];
  
  pbVar4 = (byte *)*p;
  if (*pbVar4 != 0x21) goto LAB_0037d8f9;
  do {
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
LAB_0037d8f9:
    bVar1 = *pbVar4;
  } while ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 + 0xbf) < 6);
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    return 0;
  }
  uVar6 = (uint)bVar1;
  if (bVar1 != 0x28) {
    if ((bVar1 == 0x3c) || (uVar6 == 0x7b)) {
      iVar2 = pMatches[(long)pbVar4 - (long)pStr];
      if (bVar1 + 2 == (int)pStr[iVar2]) {
        uVar6 = 0;
        while( true ) {
          pbVar4 = pbVar4 + 1;
          *p = (char *)pbVar4;
          if (pStr + iVar2 <= pbVar4) break;
          pSupps._0_8_ = pSupps._0_8_ & 0xffffffff00000000;
          uVar3 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,pSupps);
          uVar6 = uVar6 | uVar3;
          *pnSupp = *pnSupp + pSupps[0];
          pbVar4 = (byte *)*p;
        }
        if (pbVar4 == (byte *)(pStr + iVar2)) {
          return uVar6 | 1 << ((byte)*pnSupp & 0x1f);
        }
        __assertion = "*p == q";
        uVar6 = 0x61;
      }
      else {
        __assertion = "*q == **p + 1 + (**p != \'(\')";
        uVar6 = 0x5a;
      }
      goto LAB_0037dab6;
    }
    if (uVar6 != 0x5b) {
      __assertion = "0";
      uVar6 = 0x65;
      goto LAB_0037dab6;
    }
  }
  pSupps[4] = 0;
  pSupps[5] = 0;
  pSupps[6] = 0;
  pSupps[7] = 0;
  pSupps[0] = 0;
  pSupps[1] = 0;
  pSupps[2] = 0;
  pSupps[3] = 0;
  iVar2 = pMatches[(long)pbVar4 - (long)pStr];
  if (uVar6 + (bVar1 != 0x28) + 1 == (int)pStr[iVar2]) {
    lVar9 = 0;
    pnSupp_00 = pSupps;
    uVar6 = 0;
    while( true ) {
      pbVar4 = pbVar4 + 1;
      *p = (char *)pbVar4;
      if (pStr + iVar2 <= pbVar4) break;
      uVar3 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,pnSupp_00);
      *pnSupp = *pnSupp + *pnSupp_00;
      uVar6 = uVar6 | uVar3;
      pbVar4 = (byte *)*p;
      lVar9 = lVar9 + -1;
      pnSupp_00 = pnSupp_00 + 1;
    }
    if (pbVar4 == (byte *)(pStr + iVar2)) {
      if (-lVar9 == 0 || lVar9 == -1) {
        __assertion = "nParts > 1";
        uVar6 = 0x47;
      }
      else {
        uVar3 = 1;
        while( true ) {
          if (1 << ((byte)-lVar9 & 0x1f) <= (int)uVar3) {
            return uVar6;
          }
          uVar5 = 0;
          for (lVar8 = 0; -lVar8 != lVar9; lVar8 = lVar8 + 1) {
            if ((uVar3 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
              uVar5 = uVar5 + pSupps[lVar8];
            }
          }
          if (7 < uVar5 - 1) break;
          uVar7 = 1 << ((byte)uVar5 & 0x1f);
          if (uVar5 < 2) {
            uVar7 = 0;
          }
          uVar6 = uVar6 | uVar7;
          uVar3 = uVar3 + 1;
        }
        __assertion = "Sum > 0 && Sum <= 8";
        uVar6 = 0x4f;
      }
    }
    else {
      __assertion = "*p == q";
      uVar6 = 0x46;
    }
  }
  else {
    __assertion = "*q == **p + 1 + (**p != \'(\')";
    uVar6 = 0x40;
  }
LAB_0037dab6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                ,uVar6,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds all boundsets for which decomposition exists.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DsdCheckDecExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' || **p == '[' ) // and/xor
    {
        unsigned Mask = 0;
        int m, pSupps[8] = {0}, nParts = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        nMints = (1 << nParts);
        for ( m = 1; m < nMints; m++ )
        {
            int i, Sum = 0;
            for ( i = 0; i < nParts; i++ )
                if ( (m >> i) & 1 )
                    Sum += pSupps[i];
            assert( Sum > 0 && Sum <= 8 );
            if ( Sum >= 2 )
                Mask |= (1 << Sum);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        Mask |= (1 << *pnSupp);
        return Mask;
    }
    assert( 0 );
    return 0;
}